

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<InstructionVMEvalContext::Storage_*,_32U>::~SmallArray
          (SmallArray<InstructionVMEvalContext::Storage_*,_32U> *this)

{
  Storage **ppSVar1;
  
  ppSVar1 = this->data;
  if (ppSVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppSVar1 != (Storage **)0x0) {
        (*(code *)NULLC::dealloc)(ppSVar1);
      }
    }
    else if (ppSVar1 != (Storage **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}